

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_dump_listener.c
# Opt level: O0

HT_FileDumpListener *
ht_file_dump_listener_create(char *filename,size_t buffer_size,HT_ErrorCode *out_err)

{
  FILE *pFVar1;
  HT_Mutex *pHVar2;
  HT_FileDumpListener *local_30;
  HT_FileDumpListener *listener;
  HT_ErrorCode error_code;
  HT_ErrorCode *out_err_local;
  size_t buffer_size_local;
  char *filename_local;
  
  local_30 = (HT_FileDumpListener *)ht_alloc(0x28);
  if (local_30 == (HT_FileDumpListener *)0x0) {
    listener._4_4_ = HT_ERR_OUT_OF_MEMORY;
  }
  else {
    pFVar1 = fopen(filename,"wb");
    local_30->p_file = (FILE *)pFVar1;
    if (local_30->p_file == (FILE *)0x0) {
      listener._4_4_ = HT_ERR_CANT_OPEN_FILE;
    }
    else {
      pHVar2 = ht_mutex_create();
      local_30->mtx = pHVar2;
      if (local_30->mtx == (HT_Mutex *)0x0) {
        listener._4_4_ = HT_ERR_OUT_OF_MEMORY;
      }
      else {
        listener._4_4_ = ht_listener_buffer_init((HT_ListenerBuffer *)local_30,buffer_size);
        if (listener._4_4_ == HT_ERR_OK) {
          ht_timeline_listener_push_metadata(ht_file_dump_listener_callback,local_30,1);
          goto LAB_0010e12b;
        }
        ht_mutex_destroy(local_30->mtx);
      }
      fclose((FILE *)local_30->p_file);
    }
    ht_free(local_30);
    local_30 = (HT_FileDumpListener *)0x0;
  }
LAB_0010e12b:
  if (out_err != (HT_ErrorCode *)0x0) {
    *out_err = listener._4_4_;
  }
  return local_30;
}

Assistant:

HT_FileDumpListener*
ht_file_dump_listener_create(const char* filename, size_t buffer_size, HT_ErrorCode* out_err)
{
    HT_ErrorCode error_code = HT_ERR_OK;
    HT_FileDumpListener* listener = HT_CREATE_TYPE(HT_FileDumpListener);

    if (listener == NULL)
    {
        error_code = HT_ERR_OUT_OF_MEMORY;
        goto done;
    }

    listener->p_file = fopen(filename, "wb");
    if (listener->p_file == NULL)
    {
        error_code = HT_ERR_CANT_OPEN_FILE;
        goto error_open_file;
    }

    listener->mtx = ht_mutex_create();
    if (listener->mtx == NULL)
    {
        error_code = HT_ERR_OUT_OF_MEMORY;
        goto error_create_mutex;
    }

    error_code = ht_listener_buffer_init(&listener->buffer, buffer_size);
    if (error_code != HT_ERR_OK)
    {
        ht_mutex_destroy(listener->mtx);
    }
    else
    {
        ht_timeline_listener_push_metadata(ht_file_dump_listener_callback, listener, HT_TRUE);
        goto done;
    }

error_create_mutex:
    fclose(listener->p_file);

error_open_file:
    ht_free(listener);
    listener = NULL;

done:
    HT_SET_ERROR(out_err, error_code);

    return listener;
}